

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void vpermps_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  Int32 IVar2;
  UInt8 UVar3;
  Int32 IVar4;
  Int32 IVar5;
  Int32 IVar6;
  
  if (((pMyDisasm->Reserved_).VEX.state != '\x01') || ((pMyDisasm->Reserved_).VEX.pp != '\x01'))
  goto failDecode;
  UVar1 = (pMyDisasm->Reserved_).EVEX.state;
  if (UVar1 == '\x01') {
    UVar3 = (pMyDisasm->Reserved_).EVEX.W;
    if (UVar3 == '\0') goto LAB_00123d45;
LAB_00123d07:
    if (UVar3 != '\x01') {
failDecode:
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
      (pMyDisasm->Operand1).AccessMode = 0;
      (pMyDisasm->Operand2).AccessMode = 0;
      (pMyDisasm->Operand3).AccessMode = 0;
      (pMyDisasm->Operand4).AccessMode = 0;
      (pMyDisasm->Operand5).AccessMode = 0;
      (pMyDisasm->Operand6).AccessMode = 0;
      (pMyDisasm->Operand7).AccessMode = 0;
      (pMyDisasm->Operand8).AccessMode = 0;
      (pMyDisasm->Operand9).AccessMode = 0;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
      return;
    }
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpermpd",8);
    if ((pMyDisasm->Reserved_).VEX.L == '\0') {
      (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    }
  }
  else {
    if ((pMyDisasm->Reserved_).REX.W_ != '\0') {
      UVar3 = (pMyDisasm->Reserved_).EVEX.W;
      goto LAB_00123d07;
    }
LAB_00123d45:
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpermps",8);
    if ((pMyDisasm->Reserved_).VEX.L == '\0') {
      (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    }
  }
  if (UVar1 == '\x01') {
    (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
    ArgsVEX(pMyDisasm);
    return;
  }
  verifyVEXvvvv(pMyDisasm);
  UVar1 = (pMyDisasm->Reserved_).VEX.L;
  if (UVar1 == '\0') {
    IVar2 = 0xd1;
    IVar4 = 4;
    IVar5 = 0x110000;
  }
  else {
    if (UVar1 != '\x01') {
      if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') {
        return;
      }
      IVar2 = 0xd6;
      IVar4 = 0x10;
      IVar6 = 0x140000;
      goto LAB_00133dd6;
    }
    IVar2 = 0xd2;
    IVar4 = 8;
    IVar5 = 0x120000;
  }
  IVar6 = 0x140000;
  if ((pMyDisasm->Reserved_).EVEX.state != '\x01') {
    IVar6 = IVar5;
  }
LAB_00133dd6:
  (pMyDisasm->Instruction).Category = IVar6;
  (pMyDisasm->Reserved_).Register_ = IVar4;
  (pMyDisasm->Reserved_).MemDecoration = IVar2;
  GyEy(pMyDisasm);
  (pMyDisasm->Reserved_).Register_ = 0;
  return;
}

Assistant:

void __bea_callspec__ vpermps_(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
      if (GV.VEX.pp == 1) {
        if (
            ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0)) ||
            ((GV.EVEX.state != InUsePrefix) && (GV.REX.W_ == 0))
          ) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpermps");
          #endif
          if (GV.VEX.L == 0) GV.ERROR_OPCODE = UD_;
          if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
          ArgsVEX(pMyDisasm);
        }
        else if (GV.EVEX.W == 1) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpermpd");
          #endif
          if (GV.VEX.L == 0) GV.ERROR_OPCODE = UD_;
          if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
          ArgsVEX(pMyDisasm);
        }
        else {
          failDecode(pMyDisasm);
        }

      }
      else {
        failDecode(pMyDisasm);
      }
  }
  else {
    failDecode(pMyDisasm);
  }
}